

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O3

bool common_params_parse(int argc,char **argv,common_params *params,llama_example ex,
                        _func_void_int_char_ptr_ptr *print_usage)

{
  cpu_params *cpuparams;
  pointer *pplVar1;
  pointer ppcVar2;
  _func_void_common_params_ptr_int *p_Var3;
  string *psVar4;
  iterator __position;
  iterator __position_00;
  undefined8 uVar5;
  common_params *pcVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  mapped_type *ppcVar10;
  int *piVar11;
  long lVar12;
  iterator iVar13;
  char *pcVar14;
  runtime_error *this;
  invalid_argument *piVar15;
  char *pcVar16;
  pointer pcVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *antiprompt;
  mapped_type pcVar18;
  string *psVar19;
  pointer plVar20;
  char **arg_1;
  pointer ppcVar21;
  common_arg *opt;
  pointer pcVar22;
  string val2;
  string arg_prefix_1;
  string value;
  common_params_context ctx_arg;
  string val;
  string arg_prefix;
  string arg;
  string arg_2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>_>
  arg_to_options;
  common_params params_org;
  allocator<char> local_16c1;
  mapped_type local_16c0;
  string local_16b8;
  char **local_1698;
  undefined1 local_1690 [24];
  undefined1 local_1678 [16];
  _Alloc_hider local_1668;
  undefined1 local_1660;
  undefined7 uStack_165f;
  undefined1 local_1658 [16];
  _Alloc_hider local_1648;
  undefined1 local_1640;
  undefined7 uStack_163f;
  undefined1 local_1638 [16];
  _Alloc_hider local_1628;
  undefined1 local_1620;
  undefined7 uStack_161f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1618;
  undefined1 local_1608 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_15f0;
  _Alloc_hider local_15e0;
  undefined1 local_15d8 [24];
  _Alloc_hider local_15c0;
  undefined1 local_15b0 [16];
  _Alloc_hider local_15a0;
  _Base_ptr local_1598;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1590;
  char *local_1580;
  long *local_1578 [2];
  long local_1568 [2];
  undefined8 local_1558;
  _func_void_common_params_ptr *p_Stack_1550;
  _func_void_common_params_ptr_string_ptr *local_1548;
  _func_void_common_params_ptr_string_ptr_string_ptr *p_Stack_1540;
  _func_void_common_params_ptr_int *local_1538;
  common_params_context local_1530;
  undefined1 local_1500 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_14e8;
  _Alloc_hider local_14d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_14c8;
  _Alloc_hider local_14b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_14a8;
  _Alloc_hider local_1498;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1488;
  undefined2 *local_1478;
  undefined8 local_1470;
  undefined2 local_1468;
  undefined1 uStack_1466;
  undefined5 uStack_1465;
  undefined1 *local_1458;
  undefined8 local_1450;
  undefined1 local_1448;
  undefined7 uStack_1447;
  undefined1 local_1438 [16];
  undefined1 local_1428 [24];
  _Alloc_hider local_1410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1400;
  _Alloc_hider local_13f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_13e0;
  _Alloc_hider local_13d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_13c0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_13b0;
  common_params local_1378;
  
  common_params_parser_init(&local_1530,params,ex,print_usage);
  common_params::common_params(&local_1378,local_1530.params);
  pcVar6 = local_1530.params;
  local_1458 = &local_1448;
  local_1450 = 0;
  local_1448 = 0;
  local_1478 = &local_1468;
  local_1468 = 0x2d2d;
  local_1470 = 2;
  uStack_1466 = 0;
  local_13b0._M_buckets = &local_13b0._M_single_bucket;
  local_13b0._M_bucket_count = 1;
  local_13b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_13b0._M_element_count = 0;
  local_13b0._M_rehash_policy._M_max_load_factor = 1.0;
  local_13b0._M_rehash_policy._M_next_resize = 0;
  local_13b0._M_single_bucket = (__node_base_ptr)0x0;
  local_16c0 = local_1530.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  local_1698 = argv;
  if (local_1530.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_1530.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pcVar22 = local_1530.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>._M_impl
              .super__Vector_impl_data._M_start;
    do {
      ppcVar2 = (pcVar22->args).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar21 = (pcVar22->args).
                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_start; ppcVar21 != ppcVar2; ppcVar21 = ppcVar21 + 1
          ) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1608,*ppcVar21,(allocator<char> *)local_1690);
        ppcVar10 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&local_13b0,(key_type *)local_1608);
        *ppcVar10 = pcVar22;
        if ((undefined1 *)local_1608._0_8_ != local_1608 + 0x10) {
          operator_delete((void *)local_1608._0_8_,CONCAT71(local_1608._17_7_,local_1608[0x10]) + 1)
          ;
        }
      }
      pcVar22 = pcVar22 + 1;
    } while (pcVar22 != local_16c0);
    argv = local_1698;
    if (local_1530.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_1530.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pcVar22 = local_1530.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        local_1608._0_8_ = local_1608 + 0x10;
        local_1608._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_1608[0x10] = '\0';
        bVar7 = common_arg::get_value_from_env(pcVar22,(string *)local_1608);
        if (bVar7) {
          if ((pcVar22->handler_void != (_func_void_common_params_ptr *)0x0) &&
             ((iVar8 = std::__cxx11::string::compare((char *)local_1608), iVar8 == 0 ||
              (iVar8 = std::__cxx11::string::compare((char *)local_1608), iVar8 == 0)))) {
            (*pcVar22->handler_void)(pcVar6);
          }
          uVar5 = local_1608._0_8_;
          p_Var3 = pcVar22->handler_int;
          if (p_Var3 != (_func_void_common_params_ptr_int *)0x0) {
            piVar11 = __errno_location();
            local_16c0 = (mapped_type)CONCAT44(local_16c0._4_4_,*piVar11);
            *piVar11 = 0;
            lVar12 = strtol((char *)uVar5,(char **)local_1690,10);
            if (local_1690._0_8_ != uVar5) {
              if ((0xfffffffeffffffff < lVar12 - 0x80000000U) && (*piVar11 != 0x22)) {
                if (*piVar11 == 0) {
                  *piVar11 = (int)local_16c0;
                }
                (*p_Var3)(pcVar6,(int)lVar12);
                argv = local_1698;
                goto LAB_0012934b;
              }
              std::__throw_out_of_range("stoi");
            }
            std::__throw_invalid_argument("stoi");
            goto LAB_0012a001;
          }
LAB_0012934b:
          if (pcVar22->handler_string != (_func_void_common_params_ptr_string_ptr *)0x0) {
            (*pcVar22->handler_string)(pcVar6,(string *)local_1608);
          }
        }
        if ((undefined1 *)local_1608._0_8_ != local_1608 + 0x10) {
          operator_delete((void *)local_1608._0_8_,CONCAT71(local_1608._17_7_,local_1608[0x10]) + 1)
          ;
        }
        pcVar22 = pcVar22 + 1;
      } while (pcVar22 !=
               local_1530.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
  }
  if (1 < argc) {
    iVar8 = 1;
    do {
      local_1690._0_8_ = local_1690 + 0x10;
      local_1690._8_8_ = (string *)0x2;
      local_1690._16_3_ = 0x2d2d;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1438,argv[iVar8],(allocator<char> *)local_1608);
      iVar9 = std::__cxx11::string::compare((ulong)local_1438,0,(string *)local_1690._8_8_);
      if ((iVar9 == 0) && ((pointer)local_1438._8_8_ != (pointer)0x0)) {
        pcVar17 = (pointer)0x0;
        do {
          if (*(string *)(local_1438._0_8_ + (long)pcVar17) == (string)0x5f) {
            *(string *)(local_1438._0_8_ + (long)pcVar17) = (string)0x2d;
          }
          pcVar17 = pcVar17 + 1;
        } while ((pointer)local_1438._8_8_ != pcVar17);
      }
      iVar13 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(&local_13b0,(key_type *)local_1438);
      if (iVar13.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>,_true>
          ._M_cur == (__node_type *)0x0) {
        piVar15 = (invalid_argument *)__cxa_allocate_exception(0x10);
        string_format_abi_cxx11_
                  ((string *)local_1608,"error: invalid argument: %s",local_1438._0_8_);
        std::invalid_argument::invalid_argument(piVar15,(string *)local_1608);
        __cxa_throw(piVar15,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      ppcVar10 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&local_13b0,(key_type *)local_1438);
      pcVar18 = *ppcVar10;
      std::
      _Rb_tree<llama_example,_llama_example,_std::_Identity<llama_example>,_std::less<llama_example>,_std::allocator<llama_example>_>
      ::_Rb_tree((_Rb_tree<llama_example,_llama_example,_std::_Identity<llama_example>,_std::less<llama_example>,_std::allocator<llama_example>_>
                  *)local_1608,
                 (_Rb_tree<llama_example,_llama_example,_std::_Identity<llama_example>,_std::less<llama_example>,_std::allocator<llama_example>_>
                  *)pcVar18);
      std::
      _Rb_tree<llama_example,_llama_example,_std::_Identity<llama_example>,_std::less<llama_example>,_std::allocator<llama_example>_>
      ::_Rb_tree((_Rb_tree<llama_example,_llama_example,_std::_Identity<llama_example>,_std::less<llama_example>,_std::allocator<llama_example>_>
                  *)local_15d8,&(pcVar18->excludes)._M_t);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)(local_15b0 + 8),
                 &pcVar18->args);
      local_1580 = pcVar18->env;
      local_1590._M_allocated_capacity._0_4_ = *(undefined4 *)&pcVar18->value_hint;
      local_1590._M_allocated_capacity._4_4_ = *(undefined4 *)((long)&pcVar18->value_hint + 4);
      local_1590._8_4_ = *(undefined4 *)&pcVar18->value_hint_2;
      local_1590._12_4_ = *(undefined4 *)((long)&pcVar18->value_hint_2 + 4);
      local_1578[0] = local_1568;
      pcVar17 = (pcVar18->help)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1578,pcVar17,pcVar17 + (pcVar18->help)._M_string_length);
      pcVar16 = local_1580;
      local_1538 = pcVar18->handler_int;
      local_1558 = *(undefined8 *)&pcVar18->is_sparam;
      p_Stack_1550 = pcVar18->handler_void;
      local_1548 = pcVar18->handler_string;
      p_Stack_1540 = pcVar18->handler_str_str;
      if ((local_1580 != (char *)0x0) && (pcVar14 = getenv(local_1580), pcVar14 != (char *)0x0)) {
        fprintf(_stderr,
                "warn: %s environment variable is set, but will be overwritten by command line argument %s\n"
                ,pcVar16,local_1438._0_8_);
      }
      if (p_Stack_1550 == (_func_void_common_params_ptr *)0x0) {
        iVar9 = iVar8 + 1;
        if (argc <= iVar9) {
          piVar15 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar15,"expected value for argument");
          __cxa_throw(piVar15,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1500,argv[iVar9],(allocator<char> *)&local_16b8);
        uVar5 = local_1500._0_8_;
        p_Var3 = local_1538;
        if (local_1538 == (_func_void_common_params_ptr_int *)0x0) {
          if (local_1548 == (_func_void_common_params_ptr_string_ptr *)0x0) {
            iVar8 = iVar8 + 2;
            if (argc <= iVar8) {
              piVar15 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(piVar15,"expected value for argument");
              __cxa_throw(piVar15,&std::invalid_argument::typeinfo,
                          std::invalid_argument::~invalid_argument);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_16b8,argv[iVar8],&local_16c1);
            if (p_Stack_1540 != (_func_void_common_params_ptr_string_ptr_string_ptr *)0x0) {
              (*p_Stack_1540)(pcVar6,(string *)local_1500,&local_16b8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_16b8._M_dataplus._M_p != &local_16b8.field_2) {
              operator_delete(local_16b8._M_dataplus._M_p,
                              CONCAT71(local_16b8.field_2._M_allocated_capacity._1_7_,
                                       local_16b8.field_2._M_local_buf[0]) + 1);
            }
          }
          else {
            (*local_1548)(pcVar6,(string *)local_1500);
            iVar8 = iVar9;
          }
        }
        else {
          piVar11 = __errno_location();
          iVar8 = *piVar11;
          *piVar11 = 0;
          lVar12 = strtol((char *)uVar5,(char **)&local_16b8,10);
          if (local_16b8._M_dataplus._M_p == (pointer)uVar5) goto LAB_0012a00d;
          if ((lVar12 - 0x80000000U < 0xffffffff00000000) || (*piVar11 == 0x22)) goto LAB_0012a001;
          if (*piVar11 == 0) {
            *piVar11 = iVar8;
          }
          (*p_Var3)(pcVar6,(int)lVar12);
          argv = local_1698;
          iVar8 = iVar9;
        }
        if ((undefined1 *)local_1500._0_8_ != local_1500 + 0x10) {
          operator_delete((void *)local_1500._0_8_,CONCAT71(local_1500._17_7_,local_1500[0x10]) + 1)
          ;
        }
      }
      else {
        (*p_Stack_1550)(pcVar6);
      }
      if (local_1578[0] != local_1568) {
        operator_delete(local_1578[0],local_1568[0] + 1);
      }
      if ((void *)local_15b0._8_8_ != (void *)0x0) {
        operator_delete((void *)local_15b0._8_8_,(long)local_1598 - local_15b0._8_8_);
      }
      std::
      _Rb_tree<llama_example,_llama_example,_std::_Identity<llama_example>,_std::less<llama_example>,_std::allocator<llama_example>_>
      ::~_Rb_tree((_Rb_tree<llama_example,_llama_example,_std::_Identity<llama_example>,_std::less<llama_example>,_std::allocator<llama_example>_>
                   *)local_15d8);
      std::
      _Rb_tree<llama_example,_llama_example,_std::_Identity<llama_example>,_std::less<llama_example>,_std::allocator<llama_example>_>
      ::~_Rb_tree((_Rb_tree<llama_example,_llama_example,_std::_Identity<llama_example>,_std::less<llama_example>,_std::allocator<llama_example>_>
                   *)local_1608);
      if ((string *)local_1438._0_8_ != (string *)local_1428) {
        operator_delete((void *)local_1438._0_8_,CONCAT71(local_1428._1_7_,local_1428[0]) + 1);
      }
      if ((undefined1 *)local_1690._0_8_ != local_1690 + 0x10) {
        operator_delete((void *)local_1690._0_8_,(ulong)(local_1690._16_8_ + 1));
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < argc);
  }
  cpuparams = &pcVar6->cpuparams;
  postprocess_cpu_params(cpuparams,(cpu_params *)0x0);
  postprocess_cpu_params(&pcVar6->cpuparams_batch,cpuparams);
  postprocess_cpu_params(&(pcVar6->speculative).cpuparams,cpuparams);
  postprocess_cpu_params(&(pcVar6->speculative).cpuparams_batch,&pcVar6->cpuparams_batch);
  if ((pcVar6->prompt_cache_all != true) ||
     ((pcVar6->interactive == false && (pcVar6->interactive_first != true)))) {
    pcVar16 = local_1690 + 0x10;
    local_1438._0_8_ = (string *)0x1d;
    local_1690._0_8_ = pcVar16;
    local_1690._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1690,(ulong)local_1438);
    pcVar18 = (mapped_type)&pcVar6->hf_token;
    local_1690._16_8_ = local_1438._0_8_;
    builtin_strncpy((char *)local_1690._0_8_,"models/7B/ggml-model-f16.gguf",0x1d);
    local_1690._8_8_ = local_1438._0_8_;
    *(char *)(local_1690._0_8_ + local_1438._0_8_) = '\0';
    common_params_handle_model
              ((handle_model_result *)local_1608,&pcVar6->model,(string *)pcVar18,
               (string *)local_1690);
    if ((char *)local_1690._0_8_ != pcVar16) {
      operator_delete((void *)local_1690._0_8_,(ulong)(local_1690._16_8_ + 1));
    }
    if (pcVar6->no_mmproj == true) {
      local_1690._8_8_ = (string *)0x0;
      local_1690._16_8_ = local_1690._16_8_ & 0xffffffffffffff00;
      local_1668._M_p = (pointer)0x0;
      local_1660 = 0;
      local_1648._M_p = (pointer)0x0;
      local_1640 = 0;
      local_1628._M_p = (pointer)0x0;
      local_1620 = 0;
      local_16c0 = pcVar18;
      local_1690._0_8_ = pcVar16;
      local_1678._8_8_ = &local_1660;
      local_1658._8_8_ = &local_1640;
      local_1638._8_8_ = &local_1620;
      std::__cxx11::string::operator=((string *)&pcVar6->mmproj,(string *)local_1690);
      std::__cxx11::string::operator=((string *)&(pcVar6->mmproj).url,(string *)(local_1678 + 8));
      std::__cxx11::string::operator=
                ((string *)&(pcVar6->mmproj).hf_repo,(string *)(local_1658 + 8));
      std::__cxx11::string::operator=
                ((string *)&(pcVar6->mmproj).hf_file,(string *)(local_1638 + 8));
      if ((undefined1 *)local_1638._8_8_ != &local_1620) {
        operator_delete((void *)local_1638._8_8_,CONCAT71(uStack_161f,local_1620) + 1);
      }
      if ((undefined1 *)local_1658._8_8_ != &local_1640) {
        operator_delete((void *)local_1658._8_8_,CONCAT71(uStack_163f,local_1640) + 1);
      }
      pcVar18 = local_16c0;
      if ((undefined1 *)local_1678._8_8_ != &local_1660) {
        operator_delete((void *)local_1678._8_8_,CONCAT71(uStack_165f,local_1660) + 1);
      }
      if ((undefined1 *)local_1690._0_8_ != local_1690 + 0x10) {
        operator_delete((void *)local_1690._0_8_,(ulong)(local_1690._16_8_ + 1));
      }
    }
    else if (((local_1608[0] == (allocator<char>)0x1) &&
             ((pcVar6->mmproj).path._M_string_length == 0)) &&
            ((pcVar6->mmproj).url._M_string_length == 0)) {
      std::__cxx11::string::_M_assign((string *)&pcVar6->mmproj);
      std::__cxx11::string::_M_assign((string *)&(pcVar6->mmproj).url);
      std::__cxx11::string::_M_assign((string *)&(pcVar6->mmproj).hf_repo);
      std::__cxx11::string::_M_assign((string *)&(pcVar6->mmproj).hf_file);
    }
    if (mmproj_examples._M_len != 0) {
      lVar12 = 0;
      do {
        if (local_1530.ex == *(llama_example *)((long)mmproj_examples._M_array + lVar12)) {
          local_1438._8_8_ = (pointer)0x0;
          local_1428[0] = '\0';
          local_1438._0_8_ = (string *)local_1428;
          common_params_handle_model
                    ((handle_model_result *)local_1690,&pcVar6->mmproj,(string *)pcVar18,
                     (string *)local_1438);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1628._M_p != &local_1618) {
            operator_delete(local_1628._M_p,local_1618._M_allocated_capacity + 1);
          }
          if (local_1648._M_p != local_1638) {
            operator_delete(local_1648._M_p,local_1638._0_8_ + 1);
          }
          if (local_1668._M_p != local_1658) {
            operator_delete(local_1668._M_p,local_1658._0_8_ + 1);
          }
          if ((string *)local_1690._8_8_ != (string *)local_1678) {
            operator_delete((void *)local_1690._8_8_,local_1678._0_8_ + 1);
          }
          if ((string *)local_1438._0_8_ != (string *)local_1428) {
            operator_delete((void *)local_1438._0_8_,CONCAT71(local_1428._1_7_,local_1428[0]) + 1);
          }
          break;
        }
        lVar12 = lVar12 + 4;
      } while (mmproj_examples._M_len << 2 != lVar12);
    }
    local_1500._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_1500[0x10] = '\0';
    local_1500._0_8_ = local_1500 + 0x10;
    common_params_handle_model
              ((handle_model_result *)local_1438,&(pcVar6->speculative).model,(string *)pcVar18,
               (string *)local_1500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13d0._M_p != &local_13c0) {
      operator_delete(local_13d0._M_p,local_13c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13f0._M_p != &local_13e0) {
      operator_delete(local_13f0._M_p,local_13e0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1410._M_p != &local_1400) {
      operator_delete(local_1410._M_p,local_1400._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1438._8_8_ != local_1428 + 8) {
      operator_delete((void *)local_1438._8_8_,local_1428._8_8_ + 1);
    }
    if ((undefined1 *)local_1500._0_8_ != local_1500 + 0x10) {
      operator_delete((void *)local_1500._0_8_,CONCAT71(local_1500._17_7_,local_1500[0x10]) + 1);
    }
    local_16b8._M_string_length = 0;
    local_16b8.field_2._M_local_buf[0] = '\0';
    local_16b8._M_dataplus._M_p = (pointer)&local_16b8.field_2;
    common_params_handle_model
              ((handle_model_result *)local_1500,&(pcVar6->vocoder).model,(string *)pcVar18,
               &local_16b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1498._M_p != &local_1488) {
      operator_delete(local_1498._M_p,local_1488._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_14b8._M_p != &local_14a8) {
      operator_delete(local_14b8._M_p,local_14a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_14d8._M_p != &local_14c8) {
      operator_delete(local_14d8._M_p,local_14c8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1500._8_8_ != &local_14e8) {
      operator_delete((void *)local_1500._8_8_,local_14e8._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_16b8._M_dataplus._M_p != &local_16b8.field_2) {
      operator_delete(local_16b8._M_dataplus._M_p,
                      CONCAT71(local_16b8.field_2._M_allocated_capacity._1_7_,
                               local_16b8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_15a0._M_p != &local_1590) {
      operator_delete(local_15a0._M_p,
                      CONCAT44(local_1590._M_allocated_capacity._4_4_,
                               local_1590._M_allocated_capacity._0_4_) + 1);
    }
    if ((_Base_ptr)local_15c0._M_p != (_Base_ptr)local_15b0) {
      operator_delete(local_15c0._M_p,local_15b0._0_8_ + 1);
    }
    if (local_15e0._M_p != local_15d8 + 8) {
      operator_delete(local_15e0._M_p,local_15d8._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1608._8_8_ != &local_15f0) {
      operator_delete((void *)local_1608._8_8_,local_15f0._0_8_ + 1);
    }
    if (pcVar6->escape == true) {
      string_process_escapes(&pcVar6->prompt);
      string_process_escapes(&pcVar6->input_prefix);
      string_process_escapes(&pcVar6->input_suffix);
      psVar4 = (pcVar6->antiprompt).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar19 = (pcVar6->antiprompt).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar19 != psVar4;
          psVar19 = psVar19 + 1) {
        string_process_escapes(psVar19);
      }
      psVar4 = (pcVar6->sampling).dry_sequence_breakers.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar19 = (pcVar6->sampling).dry_sequence_breakers.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar19 != psVar4;
          psVar19 = psVar19 + 1) {
        string_process_escapes(psVar19);
      }
    }
    __position._M_current =
         (pcVar6->kv_overrides).
         super__Vector_base<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if ((pcVar6->kv_overrides).
        super__Vector_base<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>.
        _M_impl.super__Vector_impl_data._M_start != __position._M_current) {
      if (__position._M_current ==
          (pcVar6->kv_overrides).
          super__Vector_base<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>::
        _M_realloc_insert<>(&pcVar6->kv_overrides,__position);
        plVar20 = (pcVar6->kv_overrides).
                  super__Vector_base<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        memset(__position._M_current,0,0x108);
        plVar20 = (pcVar6->kv_overrides).
                  super__Vector_base<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>
                  ._M_impl.super__Vector_impl_data._M_finish + 1;
        (pcVar6->kv_overrides).
        super__Vector_base<llama_model_kv_override,_std::allocator<llama_model_kv_override>_>.
        _M_impl.super__Vector_impl_data._M_finish = plVar20;
      }
      plVar20[-1].key[0] = '\0';
    }
    __position_00._M_current =
         (pcVar6->tensor_buft_overrides).
         super__Vector_base<llama_model_tensor_buft_override,_std::allocator<llama_model_tensor_buft_override>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if ((pcVar6->tensor_buft_overrides).
        super__Vector_base<llama_model_tensor_buft_override,_std::allocator<llama_model_tensor_buft_override>_>
        ._M_impl.super__Vector_impl_data._M_start != __position_00._M_current) {
      local_1608._0_8_ = (char *)0x0;
      local_1608._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      if (__position_00._M_current ==
          (pcVar6->tensor_buft_overrides).
          super__Vector_base<llama_model_tensor_buft_override,_std::allocator<llama_model_tensor_buft_override>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<llama_model_tensor_buft_override,_std::allocator<llama_model_tensor_buft_override>_>
        ::_M_realloc_insert<llama_model_tensor_buft_override>
                  (&pcVar6->tensor_buft_overrides,__position_00,
                   (llama_model_tensor_buft_override *)local_1608);
      }
      else {
        (__position_00._M_current)->pattern = (char *)0x0;
        (__position_00._M_current)->buft = (ggml_backend_buffer_type_t)0x0;
        pplVar1 = &(pcVar6->tensor_buft_overrides).
                   super__Vector_base<llama_model_tensor_buft_override,_std::allocator<llama_model_tensor_buft_override>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pplVar1 = *pplVar1 + 1;
      }
    }
    if ((pcVar6->reranking != true) || (pcVar6->embedding != true)) {
      if (((pcVar6->chat_template)._M_string_length != 0) &&
         (bVar7 = common_chat_verify_template(&pcVar6->chat_template,pcVar6->use_jinja), !bVar7)) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        pcVar16 = 
        "\nnote: llama.cpp was started without --jinja, we only support commonly used templates";
        if (pcVar6->use_jinja != false) {
          pcVar16 = "";
        }
        string_format_abi_cxx11_
                  ((string *)local_1608,"error: the supplied chat template is not supported: %s%s\n"
                   ,(pcVar6->chat_template)._M_dataplus._M_p,pcVar16);
        std::runtime_error::runtime_error(this,(string *)local_1608);
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_common_arg_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_13b0);
      if (local_1478 != &local_1468) {
        operator_delete(local_1478,CONCAT53(uStack_1465,CONCAT12(uStack_1466,local_1468)) + 1);
      }
      if (local_1458 != &local_1448) {
        operator_delete(local_1458,CONCAT71(uStack_1447,local_1448) + 1);
      }
      if ((local_1530.params)->usage == true) {
        common_params_print_usage(&local_1530);
        if (local_1530.print_usage != (_func_void_int_char_ptr_ptr *)0x0) {
          (*local_1530.print_usage)(argc,local_1698);
        }
      }
      else {
        if ((local_1530.params)->completion != true) {
          common_params::~common_params(&local_1378);
          std::vector<common_arg,_std::allocator<common_arg>_>::~vector(&local_1530.options);
          return true;
        }
        common_params_print_completion(&local_1530);
      }
      exit(0);
    }
    piVar15 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar15,"error: either --embedding or --reranking can be specified, but not both");
    goto LAB_0012a138;
  }
LAB_0012a019:
  piVar15 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (piVar15,"error: --prompt-cache-all not supported in interactive mode yet\n");
LAB_0012a138:
  __cxa_throw(piVar15,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
LAB_0012a001:
  std::__throw_out_of_range("stoi");
LAB_0012a00d:
  std::__throw_invalid_argument("stoi");
  goto LAB_0012a019;
}

Assistant:

bool common_params_parse(int argc, char ** argv, common_params & params, llama_example ex, void(*print_usage)(int, char **)) {
    auto ctx_arg = common_params_parser_init(params, ex, print_usage);
    const common_params params_org = ctx_arg.params; // the example can modify the default params

    try {
        if (!common_params_parse_ex(argc, argv, ctx_arg)) {
            ctx_arg.params = params_org;
            return false;
        }
        if (ctx_arg.params.usage) {
            common_params_print_usage(ctx_arg);
            if (ctx_arg.print_usage) {
                ctx_arg.print_usage(argc, argv);
            }
            exit(0);
        }
        if (ctx_arg.params.completion) {
            common_params_print_completion(ctx_arg);
            exit(0);
        }
    } catch (const std::invalid_argument & ex) {
        fprintf(stderr, "%s\n", ex.what());
        ctx_arg.params = params_org;
        return false;
    }

    return true;
}